

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
* testing::internal::edit_distance::CalculateOptimalEdits
            (vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             *__return_storage_ptr__,vector<unsigned_long,_std::allocator<unsigned_long>_> *left,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *right)

{
  allocator<std::vector<double,_std::allocator<double>_>_> *this;
  value_type vVar1;
  value_type vVar2;
  size_t sVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  double dVar10;
  const_reference pvVar11;
  iterator __first;
  iterator __last;
  undefined4 uVar12;
  double dVar13;
  undefined1 auVar15 [16];
  value_type local_f4;
  size_type sStack_f0;
  EditType move;
  size_t r_i_2;
  size_t l_i_2;
  double local_d8;
  double replace;
  double remove;
  double add;
  size_t r_i_1;
  size_t l_i_1;
  size_t r_i;
  size_t l_i;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  local_98;
  undefined1 local_80 [8];
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  best_move;
  allocator<double> local_51;
  vector<double,_std::allocator<double>_> local_50;
  undefined1 local_38 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  costs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *right_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *left_local;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  *best_path;
  undefined1 auVar14 [16];
  
  costs.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)right;
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(left);
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     costs.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<double>::allocator(&local_51);
  std::vector<double,_std::allocator<double>_>::vector(&local_50,sVar5 + 1,&local_51);
  this = (allocator<std::vector<double,_std::allocator<double>_>_> *)
         ((long)&best_move.
                 super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(this);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_38,sVar4 + 1,&local_50,this);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)
             ((long)&best_move.
                     super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::vector<double,_std::allocator<double>_>::~vector(&local_50);
  std::allocator<double>::~allocator(&local_51);
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(left);
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     costs.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<testing::internal::edit_distance::EditType>::allocator
            ((allocator<testing::internal::edit_distance::EditType> *)((long)&l_i + 7));
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::vector(&local_98,sVar5 + 1,
           (allocator<testing::internal::edit_distance::EditType> *)((long)&l_i + 7));
  std::
  allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
  ::allocator((allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
               *)((long)&l_i + 6));
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
            *)local_80,sVar4 + 1,&local_98,
           (allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
            *)((long)&l_i + 6));
  std::
  allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
  ::~allocator((allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
                *)((long)&l_i + 6));
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::~vector(&local_98);
  std::allocator<testing::internal::edit_distance::EditType>::~allocator
            ((allocator<testing::internal::edit_distance::EditType> *)((long)&l_i + 7));
  for (r_i = 0; sVar3 = r_i,
      sVar4 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)local_38), sVar3 < sVar4; r_i = r_i + 1) {
    auVar14._8_4_ = (int)(r_i >> 0x20);
    auVar14._0_8_ = r_i;
    auVar14._12_4_ = 0x45300000;
    uVar12 = (undefined4)r_i;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)local_38,r_i);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,0);
    *pvVar7 = (auVar14._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,uVar12) - 4503599627370496.0);
    pvVar8 = std::
             vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
             ::operator[]((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                           *)local_80,r_i);
    pvVar9 = std::
             vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             ::operator[](pvVar8,0);
    *pvVar9 = kRemove;
  }
  l_i_1 = 1;
  while( true ) {
    sVar3 = l_i_1;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)local_38,0);
    sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar6);
    if (sVar4 <= sVar3) break;
    auVar15._8_4_ = (int)(l_i_1 >> 0x20);
    auVar15._0_8_ = l_i_1;
    auVar15._12_4_ = 0x45300000;
    uVar12 = (undefined4)l_i_1;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)local_38,0);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,l_i_1);
    *pvVar7 = (auVar15._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,uVar12) - 4503599627370496.0);
    pvVar8 = std::
             vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
             ::operator[]((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                           *)local_80,0);
    pvVar9 = std::
             vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             ::operator[](pvVar8,l_i_1);
    *pvVar9 = kAdd;
    l_i_1 = l_i_1 + 1;
  }
  for (r_i_1 = 0; sVar3 = r_i_1,
      sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(left), sVar3 < sVar4;
      r_i_1 = r_i_1 + 1) {
    for (add = 0.0; dVar13 = add,
        dVar10 = (double)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    costs.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage),
        (ulong)dVar13 < (ulong)dVar10; add = (double)((long)add + 1)) {
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](left,r_i_1);
      vVar2 = *pvVar11;
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           costs.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)add);
      if (vVar2 == *pvVar11) {
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_38,r_i_1);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(size_type)add);
        vVar1 = *pvVar7;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_38,r_i_1 + 1);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)add + 1);
        *pvVar7 = vVar1;
        pvVar8 = std::
                 vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                 ::operator[]((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                               *)local_80,r_i_1 + 1);
        pvVar9 = std::
                 vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                 ::operator[](pvVar8,(long)add + 1);
        *pvVar9 = kMatch;
      }
      else {
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_38,r_i_1 + 1);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(size_type)add);
        remove = *pvVar7;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_38,r_i_1);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)add + 1);
        replace = *pvVar7;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_38,r_i_1);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(size_type)add);
        local_d8 = *pvVar7;
        if ((replace <= remove) || (local_d8 <= remove)) {
          if ((remove <= replace) || (local_d8 <= replace)) {
            dVar13 = local_d8 + 1.00001;
            pvVar6 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)local_38,r_i_1 + 1);
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)add + 1);
            *pvVar7 = dVar13;
            pvVar8 = std::
                     vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                     ::operator[]((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                                   *)local_80,r_i_1 + 1);
            pvVar9 = std::
                     vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                     ::operator[](pvVar8,(long)add + 1);
            *pvVar9 = kReplace;
          }
          else {
            dVar13 = replace + 1.0;
            pvVar6 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)local_38,r_i_1 + 1);
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)add + 1);
            *pvVar7 = dVar13;
            pvVar8 = std::
                     vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                     ::operator[]((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                                   *)local_80,r_i_1 + 1);
            pvVar9 = std::
                     vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                     ::operator[](pvVar8,(long)add + 1);
            *pvVar9 = kRemove;
          }
        }
        else {
          dVar13 = remove + 1.0;
          pvVar6 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)local_38,r_i_1 + 1);
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)add + 1);
          *pvVar7 = dVar13;
          pvVar8 = std::
                   vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                   ::operator[]((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                                 *)local_80,r_i_1 + 1);
          pvVar9 = std::
                   vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                   ::operator[](pvVar8,(long)add + 1);
          *pvVar9 = kAdd;
        }
      }
    }
  }
  l_i_2._7_1_ = 0;
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::vector(__return_storage_ptr__);
  r_i_2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(left);
  sStack_f0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         costs.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  for (; r_i_2 != 0 || sStack_f0 != 0; r_i_2 = r_i_2 - (local_f4 != kAdd)) {
    pvVar8 = std::
             vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
             ::operator[]((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                           *)local_80,r_i_2);
    pvVar9 = std::
             vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             ::operator[](pvVar8,sStack_f0);
    local_f4 = *pvVar9;
    std::
    vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
    ::push_back(__return_storage_ptr__,&local_f4);
    sStack_f0 = sStack_f0 - (local_f4 != kRemove);
  }
  __first = std::
            vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
            ::begin(__return_storage_ptr__);
  __last = std::
           vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
           ::end(__return_storage_ptr__);
  std::
  reverse<__gnu_cxx::__normal_iterator<testing::internal::edit_distance::EditType*,std::vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>>>
            ((__normal_iterator<testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
              )__first._M_current,
             (__normal_iterator<testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
              )__last._M_current);
  l_i_2._7_1_ = 1;
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::~vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
             *)local_80);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<EditType> CalculateOptimalEdits(const std::vector<size_t>& left,
                                            const std::vector<size_t>& right) {
  std::vector<std::vector<double> > costs(
      left.size() + 1, std::vector<double>(right.size() + 1));
  std::vector<std::vector<EditType> > best_move(
      left.size() + 1, std::vector<EditType>(right.size() + 1));

  // Populate for empty right.
  for (size_t l_i = 0; l_i < costs.size(); ++l_i) {
    costs[l_i][0] = static_cast<double>(l_i);
    best_move[l_i][0] = kRemove;
  }
  // Populate for empty left.
  for (size_t r_i = 1; r_i < costs[0].size(); ++r_i) {
    costs[0][r_i] = static_cast<double>(r_i);
    best_move[0][r_i] = kAdd;
  }

  for (size_t l_i = 0; l_i < left.size(); ++l_i) {
    for (size_t r_i = 0; r_i < right.size(); ++r_i) {
      if (left[l_i] == right[r_i]) {
        // Found a match. Consume it.
        costs[l_i + 1][r_i + 1] = costs[l_i][r_i];
        best_move[l_i + 1][r_i + 1] = kMatch;
        continue;
      }

      const double add = costs[l_i + 1][r_i];
      const double remove = costs[l_i][r_i + 1];
      const double replace = costs[l_i][r_i];
      if (add < remove && add < replace) {
        costs[l_i + 1][r_i + 1] = add + 1;
        best_move[l_i + 1][r_i + 1] = kAdd;
      } else if (remove < add && remove < replace) {
        costs[l_i + 1][r_i + 1] = remove + 1;
        best_move[l_i + 1][r_i + 1] = kRemove;
      } else {
        // We make replace a little more expensive than add/remove to lower
        // their priority.
        costs[l_i + 1][r_i + 1] = replace + 1.00001;
        best_move[l_i + 1][r_i + 1] = kReplace;
      }
    }
  }

  // Reconstruct the best path. We do it in reverse order.
  std::vector<EditType> best_path;
  for (size_t l_i = left.size(), r_i = right.size(); l_i > 0 || r_i > 0;) {
    EditType move = best_move[l_i][r_i];
    best_path.push_back(move);
    l_i -= move != kAdd;
    r_i -= move != kRemove;
  }
  std::reverse(best_path.begin(), best_path.end());
  return best_path;
}